

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void lowbd_fwd_txfm2d_16x8_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  char cVar2;
  int8_t *piVar3;
  int iVar4;
  int iVar5;
  byte in_CL;
  int lr_flip;
  int ud_flip;
  __m128i *buf;
  transform_1d_sse2 row_txfm;
  transform_1d_avx2_conflict1 col_txfm;
  int height;
  int width;
  int cos_bit_row;
  int cos_bit_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m256i buf2 [8];
  __m128i buf1 [16];
  __m128i buf0 [16];
  int local_3a0;
  int in_stack_fffffffffffffc64;
  __m128i *in_stack_fffffffffffffc68;
  __m128i *out;
  __m256i *in;
  __m128i *in_00;
  int in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca4;
  __m256i *in_stack_fffffffffffffca8;
  longlong local_250 [23];
  __m256i *in_stack_fffffffffffffe68;
  __m256i *in_stack_fffffffffffffe70;
  longlong local_150 [16];
  longlong alStack_d0 [17];
  byte local_45;
  
  piVar3 = av1_fwd_txfm_shift_ls[8];
  local_45 = in_CL;
  iVar4 = get_txw_idx('\b');
  iVar5 = get_txh_idx('\b');
  cVar1 = av1_fwd_cos_bit_col[iVar4][iVar5];
  cVar2 = av1_fwd_cos_bit_row[iVar4][iVar5];
  in_00 = (__m128i *)col_txfm16x8_arr[local_45];
  in = (__m256i *)row_txfm16x8_arr[local_45];
  get_flip_cfg(local_45,(int *)&stack0xfffffffffffffc64,&local_3a0);
  iVar4 = (int)((ulong)in >> 0x20);
  if (in_stack_fffffffffffffc64 == 0) {
    load_buffer_16bit_to_16bit((int16_t *)in_00,iVar4,in_stack_fffffffffffffc68,0);
    load_buffer_16bit_to_16bit
              ((int16_t *)in_00,(int)((ulong)in >> 0x20),in_stack_fffffffffffffc68,
               in_stack_fffffffffffffc64);
  }
  else {
    load_buffer_16bit_to_16bit_flip
              ((int16_t *)in_00,iVar4,in_stack_fffffffffffffc68,in_stack_fffffffffffffc64);
    load_buffer_16bit_to_16bit_flip
              ((int16_t *)in_00,(int)((ulong)in >> 0x20),in_stack_fffffffffffffc68,
               in_stack_fffffffffffffc64);
  }
  pack_reg((__m128i *)local_150,(__m128i *)alStack_d0,(__m256i *)&stack0xfffffffffffffca0);
  round_shift_16bit_w16_avx2
            (in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,in_stack_fffffffffffffca0);
  (*(code *)in_00)(&stack0xfffffffffffffca0,&stack0xfffffffffffffca0,(int)cVar1);
  round_shift_16bit_w16_avx2
            (in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,in_stack_fffffffffffffca0);
  transpose_16bit_16x8_avx2(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  extract_reg(in,in_stack_fffffffffffffc68);
  if (local_3a0 == 0) {
    out = (__m128i *)local_250;
  }
  else {
    out = (__m128i *)local_150;
    flip_buf_sse2((__m128i *)local_250,out,0x10);
  }
  (*(code *)in)(out,out,(int)cVar2);
  round_shift_16bit(out,0x10,(int)piVar3[2]);
  store_rect_buffer_16bit_to_32bit_w8(in_00,(int32_t *)in,(int)((ulong)out >> 0x20),(int)out);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_16x8_avx2(const int16_t *input, int32_t *output,
                                       int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[16];
  __m256i buf2[8];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X8];
  const int txw_idx = get_txw_idx(TX_16X8);
  const int txh_idx = get_txh_idx(TX_16X8);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 16;
  const int height = 8;
  const transform_1d_avx2 col_txfm = col_txfm16x8_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm16x8_arr[tx_type];
  __m128i *buf;
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  if (ud_flip) {
    load_buffer_16bit_to_16bit_flip(input + 8 * 0, stride, buf0, height);
    load_buffer_16bit_to_16bit_flip(input + 8 * 1, stride, &buf0[8], height);
  } else {
    load_buffer_16bit_to_16bit(input + 8 * 0, stride, buf0, height);
    load_buffer_16bit_to_16bit(input + 8 * 1, stride, &buf0[8], height);
  }
  pack_reg(buf0, &buf0[8], buf2);
  round_shift_16bit_w16_avx2(buf2, height, shift[0]);
  col_txfm(buf2, buf2, cos_bit_col);
  round_shift_16bit_w16_avx2(buf2, height, shift[1]);
  transpose_16bit_16x8_avx2(buf2, buf2);
  extract_reg(buf2, buf1);

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w8(buf, output, height, width);
}